

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

void __thiscall
slang::syntax::UserDefinedNetDeclarationSyntax::setChild
          (UserDefinedNetDeclarationSyntax *this,size_t index,TokenOrSyntax child)

{
  (*(code *)(&DAT_00484544 + *(int *)(&DAT_00484544 + index * 4)))();
  return;
}

Assistant:

void UserDefinedNetDeclarationSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: netType = child.token(); return;
        case 2: delay = child.node() ? &child.node()->as<TimingControlSyntax>() : nullptr; return;
        case 3: declarators = child.node()->as<SeparatedSyntaxList<DeclaratorSyntax>>(); return;
        case 4: semi = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}